

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gga_x_fd_lb94.c
# Opt level: O2

double FT_inter(double x)

{
  double dVar1;
  
  dVar1 = xc_expint_e1_impl(x * x,1);
  return dVar1;
}

Assistant:

GPU_FUNCTION
static inline double FT_inter(int n, double x, double fd_beta)
{
  static double fd_csi = M_CBRT2;
  double mlog;
  mlog = (n == 0) ? 1 : log(x);

  return -3.0/4.0 * fd_beta*fd_csi*mlog /
    (1.0 + 3.0*fd_beta*fd_csi*x*log(fd_csi*x + sqrt(fd_csi*fd_csi*x*x + 1.0)));
}